

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

int __thiscall
QSocks5SocketEngine::bind(QSocks5SocketEngine *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  __atomic_base<int> _Var1;
  QSocks5SocketEnginePrivate *this_00;
  QUdpSocket *pQVar2;
  QHostAddressPrivate *pQVar3;
  QTcpSocket *pQVar4;
  QDeadlineTimer deadline;
  char cVar5;
  bool bVar6;
  quint16 qVar7;
  NetworkLayerProtocol NVar8;
  SocketType SVar9;
  SocketState SVar10;
  SocketError error;
  Socks5Mode socks5Mode;
  undefined4 in_register_00000034;
  int iVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QHostAddress address;
  QString local_88;
  qint64 local_70;
  undefined8 local_68;
  QHostAddress local_60;
  QString local_58;
  long local_38;
  
  qVar7 = (quint16)__addr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSocks5SocketEnginePrivate **)(this + 8);
  local_60.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&local_60);
  NVar8 = QHostAddress::protocol((QHostAddress *)CONCAT44(in_register_00000034,__fd));
  if (NVar8 == AnyIPProtocol) {
    QHostAddress::operator=(&local_60,AnyIPv4);
  }
  else {
    QHostAddress::operator=(&local_60,(QHostAddress *)CONCAT44(in_register_00000034,__fd));
  }
  if (this_00->data == (QSocks5Data *)0x0) {
    SVar9 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)this);
    if (SVar9 == TcpSocket) {
      socks5Mode = BindMode;
LAB_0023aa09:
      QSocks5SocketEnginePrivate::initialize(this_00,socks5Mode);
      goto LAB_0023aa11;
    }
    SVar9 = QAbstractSocketEngine::socketType((QAbstractSocketEngine *)this);
    socks5Mode = UdpAssociateMode;
    if (SVar9 == UdpSocket) goto LAB_0023aa09;
  }
  else {
LAB_0023aa11:
    if (this_00->mode == BindMode) {
      QHostAddress::operator=(&(this_00->super_QAbstractSocketEnginePrivate).localAddress,&local_60)
      ;
LAB_0023aaa5:
      (this_00->super_QAbstractSocketEnginePrivate).localPort = qVar7;
      pQVar4 = this_00->data->controlSocket;
      QNetworkProxy::hostName(&local_58,&this_00->proxyInfo);
      qVar7 = QNetworkProxy::port(&this_00->proxyInfo);
      (**(code **)(*(long *)&pQVar4->super_QAbstractSocket + 0xf8))(pQVar4,&local_58,qVar7,3,2);
      if ((QHostAddressPrivate *)local_58.d.d != (QHostAddressPrivate *)0x0) {
        LOCK();
        (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if ((__int_type)
            (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_70 = 0;
      local_68 = 0x100000000;
      iVar11 = 0;
      QDeadlineTimer::setPreciseRemainingTime((longlong)&local_70,0,0x2a05f200);
      deadline.t2 = (undefined4)local_68;
      deadline.type = local_68._4_4_;
      deadline.t1 = local_70;
      bVar6 = QSocks5SocketEnginePrivate::waitForConnected(this_00,deadline,(bool *)0x0);
      if (!bVar6) goto LAB_0023accb;
      SVar10 = QAbstractSocket::state(&this_00->data->controlSocket->super_QAbstractSocket);
      if (SVar10 != UnconnectedState) {
        if (this_00->socks5State == UdpAssociateSuccess) {
          QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,BoundState);
          QHostAddress::operator=
                    (&this_00->udpData->associateAddress,
                     &(this_00->super_QAbstractSocketEnginePrivate).localAddress);
          QHostAddress::QHostAddress((QHostAddress *)&local_58);
          pQVar3 = (this_00->super_QAbstractSocketEnginePrivate).localAddress.d.d.ptr;
          (this_00->super_QAbstractSocketEnginePrivate).localAddress.d.d.ptr =
               (QHostAddressPrivate *)local_58.d.d;
          local_58.d.d = (Data *)pQVar3;
          QHostAddress::~QHostAddress((QHostAddress *)&local_58);
          this_00->udpData->associatePort = (this_00->super_QAbstractSocketEnginePrivate).localPort;
          (this_00->super_QAbstractSocketEnginePrivate).localPort = 0;
        }
        else {
          if (this_00->socks5State != BindSuccess) {
            QVar12.m_data = (storage_type *)0x1b;
            QVar12.m_size = (qsizetype)&local_58;
            QString::fromLatin1(QVar12);
            local_88.d.d = local_58.d.d;
            local_88.d.ptr = local_58.d.ptr;
            local_88.d.size = local_58.d.size;
            QAbstractSocketEngine::setError
                      ((QAbstractSocketEngine *)this,SocketTimeoutError,&local_88);
            if ((QHostAddressPrivate *)local_88.d.d != (QHostAddressPrivate *)0x0) {
              LOCK();
              (((QSharedData *)&(local_88.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (((QSharedData *)&(local_88.d.d)->super_QArrayData)->ref).
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i + -1;
              _Var1._M_i = (((QSharedData *)&(local_88.d.d)->super_QArrayData)->ref).
                           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                           super___atomic_base<int>._M_i;
              UNLOCK();
              pQVar3 = (QHostAddressPrivate *)local_88.d.d;
              goto joined_r0x0023acb3;
            }
            goto LAB_0023acc8;
          }
          QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,BoundState);
        }
        iVar11 = 1;
        goto LAB_0023accb;
      }
    }
    else if (this_00->mode == UdpAssociateMode) {
      pQVar2 = this_00->udpData->udpSocket;
      cVar5 = (**(code **)(*(long *)&pQVar2->super_QAbstractSocket + 0xf0))
                        (pQVar2,&local_60,(ulong)__addr & 0xffff,0);
      if (cVar5 != '\0') {
        QAbstractSocket::localAddress((QAbstractSocket *)&local_58);
        pQVar3 = (this_00->super_QAbstractSocketEnginePrivate).localAddress.d.d.ptr;
        (this_00->super_QAbstractSocketEnginePrivate).localAddress.d.d.ptr =
             (QHostAddressPrivate *)local_58.d.d;
        local_58.d.d = (Data *)pQVar3;
        QHostAddress::~QHostAddress((QHostAddress *)&local_58);
        qVar7 = QAbstractSocket::localPort(&this_00->udpData->udpSocket->super_QAbstractSocket);
        goto LAB_0023aaa5;
      }
      error = QAbstractSocket::error(&this_00->udpData->udpSocket->super_QAbstractSocket);
      QIODevice::errorString();
      QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,error,&local_58);
      if ((QHostAddressPrivate *)local_58.d.d == (QHostAddressPrivate *)0x0) goto LAB_0023acc8;
      LOCK();
      (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
      _Var1._M_i = (((QSharedData *)&(local_58.d.d)->super_QArrayData)->ref).
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar3 = (QHostAddressPrivate *)local_58.d.d;
joined_r0x0023acb3:
      if (_Var1._M_i == 0) {
        QArrayData::deallocate((QArrayData *)pQVar3,2,0x10);
      }
    }
  }
LAB_0023acc8:
  iVar11 = 0;
LAB_0023accb:
  QHostAddress::~QHostAddress(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar11;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::bind(const QHostAddress &addr, quint16 port)
{
    Q_D(QSocks5SocketEngine);

    // when bind we will block until the bind is finished as the info from the proxy server is needed

    QHostAddress address;
    if (addr.protocol() == QAbstractSocket::AnyIPProtocol)
        address = QHostAddress::AnyIPv4; //SOCKS5 doesn't support dual stack, and there isn't any implementation of udp on ipv6 yet
    else
        address = addr;

    if (!d->data) {
        if (socketType() == QAbstractSocket::TcpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::BindMode);
#ifndef QT_NO_UDPSOCKET
        } else if (socketType() == QAbstractSocket::UdpSocket) {
            d->initialize(QSocks5SocketEnginePrivate::UdpAssociateMode);
#endif
        } else {
            //### something invalid
            return false;
        }
    }

#ifndef QT_NO_UDPSOCKET
    if (d->mode == QSocks5SocketEnginePrivate::UdpAssociateMode) {
        if (!d->udpData->udpSocket->bind(address, port)) {
            QSOCKS5_Q_DEBUG << "local udp bind failed";
            setError(d->udpData->udpSocket->error(), d->udpData->udpSocket->errorString());
            return false;
        }
        d->localAddress = d->udpData->udpSocket->localAddress();
        d->localPort = d->udpData->udpSocket->localPort();
    } else
#endif
    if (d->mode == QSocks5SocketEnginePrivate::BindMode) {
        d->localAddress = address;
        d->localPort = port;
    } else {
        //### something invalid
        return false;
    }

    d->data->controlSocket->connectToHost(d->proxyInfo.hostName(), d->proxyInfo.port());
    if (!d->waitForConnected(QDeadlineTimer{Socks5BlockingBindTimeout}, nullptr) ||
        d->data->controlSocket->state() == QAbstractSocket::UnconnectedState) {
        // waitForConnected sets the error state and closes the socket
        QSOCKS5_Q_DEBUG << "waitForConnected to proxy server" << d->data->controlSocket->errorString();
        return false;
    }
    if (d->socks5State == QSocks5SocketEnginePrivate::BindSuccess) {
        setState(QAbstractSocket::BoundState);
        return true;
#ifndef QT_NO_UDPSOCKET
    } else if (d->socks5State == QSocks5SocketEnginePrivate::UdpAssociateSuccess) {
        setState(QAbstractSocket::BoundState);
        d->udpData->associateAddress = d->localAddress;
        d->localAddress = QHostAddress();
        d->udpData->associatePort = d->localPort;
        d->localPort = 0;
        return true;
#endif // QT_NO_UDPSOCKET
    }

    // binding timed out
    setError(QAbstractSocket::SocketTimeoutError,
             QLatin1StringView(QT_TRANSLATE_NOOP("QSocks5SocketEngine", "Network operation timed out")));

///###    delete d->udpSocket;
///###    d->udpSocket = 0;
    return false;
}